

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string * el::base::utils::File::extractPathFromFilename
                   (string *__return_storage_ptr__,string *fullPath,char *separator)

{
  bool bVar1;
  long lVar2;
  allocator local_19;
  
  bVar1 = ::std::operator==(fullPath,"");
  if ((!bVar1) &&
     (lVar2 = ::std::__cxx11::string::find((char *)fullPath,(ulong)separator), lVar2 != -1)) {
    lVar2 = ::std::__cxx11::string::find_last_of((char *)fullPath,(ulong)separator);
    if (lVar2 != 0) {
      ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)fullPath);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,separator,&local_19);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fullPath);
  return __return_storage_ptr__;
}

Assistant:

std::string File::extractPathFromFilename(const std::string& fullPath, const char* separator) {
  if ((fullPath == "") || (fullPath.find(separator) == std::string::npos)) {
    return fullPath;
  }
  std::size_t lastSlashAt = fullPath.find_last_of(separator);
  if (lastSlashAt == 0) {
    return std::string(separator);
  }
  return fullPath.substr(0, lastSlashAt + 1);
}